

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::Configure(cmake *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type mVar3;
  cmState *pcVar4;
  cmMessenger *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  byte bVar14;
  bool b;
  bool b_00;
  key_type local_50;
  
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"deprecated","");
  this_00 = &this->DiagLevels;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::find(&this_00->_M_t,&local_50);
  p_Var1 = &(this->DiagLevels)._M_t._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"deprecated","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
              ::operator[](this_00,&local_50);
    mVar3 = *pmVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (mVar3 < (DIAG_ERROR|DIAG_WARN)) {
      bVar14 = (byte)mVar3 & 7;
      SetSuppressDeprecatedWarnings(this,(bool)(1 >> bVar14));
      SetDeprecatedWarningsAsErrors(this,(bool)(4U >> bVar14 & 1));
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dev","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::find(&this_00->_M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node == p_Var1) goto LAB_002110c3;
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_WARN_DEPRECATED","");
  pcVar11 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_ERROR_DEPRECATED","");
  pcVar12 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar7 = pcVar11 != (char *)0x0;
  bVar6 = pcVar12 != (char *)0x0;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dev","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
            ::operator[](this_00,&local_50);
  mVar3 = *pmVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (mVar3 == DIAG_ERROR) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,true);
    if (bVar7 || bVar6) goto LAB_002110c3;
    b_00 = true;
  }
  else if (mVar3 == DIAG_WARN) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,false);
    b_00 = false;
    if (bVar7 || bVar6) goto LAB_002110c3;
  }
  else {
    if (mVar3 != DIAG_IGNORE) goto LAB_002110c3;
    SetSuppressDevWarnings(this,true);
    b_00 = false;
    SetDevWarningsAsErrors(this,false);
    if (bVar7 || bVar6) goto LAB_002110c3;
    b = true;
  }
  SetSuppressDeprecatedWarnings(this,b);
  SetDeprecatedWarningsAsErrors(this,b_00);
LAB_002110c3:
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_WARN_DEPRECATED","");
  pcVar11 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = this->Messenger;
  if (pcVar11 == (char *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = cmSystemTools::IsOff(pcVar11);
  }
  pcVar5->SuppressDeprecatedWarnings = bVar7;
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_ERROR_DEPRECATED","");
  pcVar11 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = this->Messenger;
  bVar7 = cmSystemTools::IsOn(pcVar11);
  pcVar5->DeprecatedWarningsAsErrors = bVar7;
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
  pcVar11 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = this->Messenger;
  bVar7 = cmSystemTools::IsOn(pcVar11);
  pcVar5->SuppressDevWarnings = bVar7;
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
  pcVar11 = cmState::GetCacheEntryValue(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = this->Messenger;
  if (pcVar11 == (char *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = cmSystemTools::IsOff(pcVar11);
  }
  pcVar5->DevWarningsAsErrors = bVar7;
  iVar8 = ActualConfigure(this);
  pcVar4 = this->State;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  pcVar11 = cmState::GetGlobalProperty(pcVar4,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    sVar13 = strlen(pcVar11);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar11,pcVar11 + sVar13);
    iVar8 = HandleDeleteCacheVariables(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar8;
}

Assistant:

int cmake::Configure()
{
  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    const char* cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    const char* cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  // Cache variables may have already been set by a previous invocation,
  // so we cannot rely on command line options alone. Always ensure our
  // messenger is in sync with the cache.
  const char* value = this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  this->Messenger->SetSuppressDeprecatedWarnings(value &&
                                                 cmSystemTools::IsOff(value));

  value = this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");
  this->Messenger->SetDeprecatedWarningsAsErrors(cmSystemTools::IsOn(value));

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  this->Messenger->SetSuppressDevWarnings(cmSystemTools::IsOn(value));

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_ERRORS");
  this->Messenger->SetDevWarningsAsErrors(value &&
                                          cmSystemTools::IsOff(value));

  int ret = this->ActualConfigure();
  const char* delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && delCacheVars[0] != 0) {
    return this->HandleDeleteCacheVariables(delCacheVars);
  }
  return ret;
}